

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

Position * indk::Position::getQuotient(Position *P,float D)

{
  uint uVar1;
  uint uVar2;
  Position *this;
  vector<float,_std::allocator<float>_> local_60;
  float local_38;
  uint local_34;
  undefined1 local_30 [4];
  uint i;
  vector<float,_std::allocator<float>_> PV;
  float D_local;
  Position *P_local;
  
  PV.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = D;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_30);
  local_34 = 0;
  while( true ) {
    uVar2 = local_34;
    uVar1 = getDimensionsCount(P);
    if (uVar1 <= uVar2) break;
    local_38 = getPositionValue(P,local_34);
    local_38 = local_38 /
               PV.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_30,&local_38);
    local_34 = local_34 + 1;
  }
  this = (Position *)operator_new(0x10);
  uVar2 = getXm(P);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_60,(vector<float,_std::allocator<float>_> *)local_30);
  Position(this,uVar2,&local_60);
  std::vector<float,_std::allocator<float>_>::~vector(&local_60);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_30);
  return this;
}

Assistant:

indk::Position* indk::Position::getQuotient(const indk::Position *P, float D) {
    std::vector<float> PV;
    for (unsigned int i = 0; i < P->getDimensionsCount(); i++) {
        PV.push_back(P->getPositionValue(i)/D);
    }
    return new indk::Position(P->getXm(), PV);
}